

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

TCGv_i32 rotate_x(TCGContext_conflict2 *tcg_ctx,TCGv_i32 reg,TCGv_i32 shift,int left,int size)

{
  TCGv_i32 pTVar1;
  TCGv_i32 ret;
  TCGv_i32 ret_00;
  TCGv_i32 ret_01;
  TCGv_i32 c2;
  TCGv_i32 zero;
  TCGv_i32 sz;
  TCGv_i32 shx;
  TCGv_i32 shr;
  TCGv_i32 shl;
  TCGv_i32 X;
  int size_local;
  int left_local;
  TCGv_i32 shift_local;
  TCGv_i32 reg_local;
  TCGContext_conflict2 *tcg_ctx_local;
  
  pTVar1 = tcg_const_i32_m68k(tcg_ctx,size);
  ret = tcg_temp_new_i32(tcg_ctx);
  ret_00 = tcg_temp_new_i32(tcg_ctx);
  ret_01 = tcg_temp_new_i32(tcg_ctx);
  if (left == 0) {
    tcg_gen_mov_i32(tcg_ctx,ret,shift);
    tcg_gen_movi_i32(tcg_ctx,ret_00,size + 1);
    tcg_gen_sub_i32(tcg_ctx,ret_00,ret_00,shift);
    tcg_gen_sub_i32(tcg_ctx,ret_01,pTVar1,shift);
  }
  else {
    tcg_gen_mov_i32(tcg_ctx,ret_00,shift);
    tcg_gen_movi_i32(tcg_ctx,ret,size + 1);
    tcg_gen_sub_i32(tcg_ctx,ret,ret,shift);
    tcg_gen_subi_i32_m68k(tcg_ctx,ret_01,shift,1);
    c2 = tcg_const_i32_m68k(tcg_ctx,0);
    tcg_gen_movcond_i32_m68k(tcg_ctx,TCG_COND_LT,ret_01,ret_01,c2,pTVar1,ret_01);
    tcg_temp_free_i32(tcg_ctx,c2);
  }
  tcg_temp_free_i32(tcg_ctx,pTVar1);
  tcg_gen_shl_i32(tcg_ctx,ret_00,reg,ret_00);
  tcg_gen_shr_i32(tcg_ctx,ret,reg,ret);
  tcg_gen_or_i32(tcg_ctx,reg,ret_00,ret);
  tcg_temp_free_i32(tcg_ctx,ret_00);
  tcg_temp_free_i32(tcg_ctx,ret);
  tcg_gen_shl_i32(tcg_ctx,ret_01,QREG_CC_X,ret_01);
  tcg_gen_or_i32(tcg_ctx,reg,reg,ret_01);
  tcg_temp_free_i32(tcg_ctx,ret_01);
  pTVar1 = tcg_temp_new_i32(tcg_ctx);
  tcg_gen_extract_i32_m68k(tcg_ctx,pTVar1,reg,size,1);
  return pTVar1;
}

Assistant:

static TCGv rotate_x(TCGContext *tcg_ctx, TCGv reg, TCGv shift, int left, int size)
{
    TCGv X, shl, shr, shx, sz, zero;

    sz = tcg_const_i32(tcg_ctx, size);

    shr = tcg_temp_new(tcg_ctx);
    shl = tcg_temp_new(tcg_ctx);
    shx = tcg_temp_new(tcg_ctx);
    if (left) {
        tcg_gen_mov_i32(tcg_ctx, shl, shift);      /* shl = shift */
        tcg_gen_movi_i32(tcg_ctx, shr, size + 1);
        tcg_gen_sub_i32(tcg_ctx, shr, shr, shift); /* shr = size + 1 - shift */
        tcg_gen_subi_i32(tcg_ctx, shx, shift, 1);  /* shx = shift - 1 */
        /* shx = shx < 0 ? size : shx; */
        zero = tcg_const_i32(tcg_ctx, 0);
        tcg_gen_movcond_i32(tcg_ctx, TCG_COND_LT, shx, shx, zero, sz, shx);
        tcg_temp_free(tcg_ctx, zero);
    } else {
        tcg_gen_mov_i32(tcg_ctx, shr, shift);      /* shr = shift */
        tcg_gen_movi_i32(tcg_ctx, shl, size + 1);
        tcg_gen_sub_i32(tcg_ctx, shl, shl, shift); /* shl = size + 1 - shift */
        tcg_gen_sub_i32(tcg_ctx, shx, sz, shift); /* shx = size - shift */
    }
    tcg_temp_free_i32(tcg_ctx, sz);

    /* reg = (reg << shl) | (reg >> shr) | (x << shx); */

    tcg_gen_shl_i32(tcg_ctx, shl, reg, shl);
    tcg_gen_shr_i32(tcg_ctx, shr, reg, shr);
    tcg_gen_or_i32(tcg_ctx, reg, shl, shr);
    tcg_temp_free(tcg_ctx, shl);
    tcg_temp_free(tcg_ctx, shr);
    tcg_gen_shl_i32(tcg_ctx, shx, QREG_CC_X, shx);
    tcg_gen_or_i32(tcg_ctx, reg, reg, shx);
    tcg_temp_free(tcg_ctx, shx);

    /* X = (reg >> size) & 1 */

    X = tcg_temp_new(tcg_ctx);
    tcg_gen_extract_i32(tcg_ctx, X, reg, size, 1);

    return X;
}